

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptExceptionOperators.cpp
# Opt level: O3

JavascriptFunction *
Js::JavascriptExceptionOperators::WalkStackForExceptionContextInternal
          (ScriptContext *scriptContext,JavascriptExceptionContext *exceptionContext,
          Var thrownObject,uint32 *callerByteCodeOffset,uint64 stackCrawlLimit,PVOID returnAddress,
          bool isThrownException,bool resetStack)

{
  size_t *this;
  Type *pTVar1;
  Type *addr;
  JavascriptExceptionObject *pJVar2;
  code *pcVar3;
  bool bVar4;
  BOOL BVar5;
  uint32 uVar6;
  int iVar7;
  undefined4 *puVar8;
  Recycler *alloc;
  List<Js::JavascriptExceptionContext::StackFrame,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *this_00;
  JavascriptError *pJVar9;
  JavascriptFunction *this_01;
  ulong uVar10;
  byte initArgumentTypes;
  bool bVar11;
  undefined1 local_128 [8];
  JavascriptStackWalker walker;
  TrackAllocData data;
  AutoNestedHandledExceptionType local_4c;
  JavascriptFunction *pJStack_48;
  AutoNestedHandledExceptionType __autoNestedHandledExceptionType;
  JavascriptFunction *jsFunc;
  
  JavascriptStackWalker::JavascriptStackWalker
            ((JavascriptStackWalker *)local_128,scriptContext,true,returnAddress,false);
  pJStack_48 = (JavascriptFunction *)0x0;
  BVar5 = GetCaller((JavascriptStackWalker *)local_128,&stack0xffffffffffffffb8);
  if (BVar5 == 0) {
LAB_00a95b4d:
    this_01 = (JavascriptFunction *)0x0;
    goto LAB_00a95c51;
  }
  bVar4 = JavascriptFunction::IsLibraryCode(pJStack_48);
  if (bVar4) {
    BVar5 = JavascriptStackWalker::GetNonLibraryCodeCaller
                      ((JavascriptStackWalker *)local_128,&stack0xffffffffffffffb8);
    if (BVar5 == 0) goto LAB_00a95b4d;
  }
  this_01 = pJStack_48;
  uVar6 = JavascriptStackWalker::GetByteCodeOffset((JavascriptStackWalker *)local_128);
  *callerByteCodeOffset = uVar6;
  bVar4 = JavascriptFunction::IsLibraryCode(this_01);
  if (bVar4) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptExceptionOperators.cpp"
                       ,0x472,"(!caller->IsLibraryCode())","!caller->IsLibraryCode()");
    if (!bVar4) goto LAB_00a95e34;
    *puVar8 = 0;
  }
  AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
            (&local_4c,
             ExceptionType_JavascriptException|ExceptionType_StackOverflow|ExceptionType_OutOfMemory
            );
  walker.currentFrame.stackCheckCodeHeight =
       (size_t)&JsUtil::
                List<Js::JavascriptExceptionContext::StackFrame,Memory::Recycler,false,Js::CopyRemovePolicy,DefaultComparer>
                ::typeinfo;
  alloc = Memory::Recycler::TrackAllocInfo
                    (scriptContext->recycler,
                     (TrackAllocData *)&walker.currentFrame.stackCheckCodeHeight);
  this_00 = (List<Js::JavascriptExceptionContext::StackFrame,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
             *)new<Memory::Recycler>(0x30,alloc,0x387914);
  (this_00->
  super_ReadOnlyList<Js::JavascriptExceptionContext::StackFrame,_Memory::Recycler,_DefaultComparer>)
  .alloc = scriptContext->recycler;
  (this_00->
  super_ReadOnlyList<Js::JavascriptExceptionContext::StackFrame,_Memory::Recycler,_DefaultComparer>)
  ._vptr_ReadOnlyList = (_func_int **)&PTR_IsReadOnly_014e9d38;
  (this_00->
  super_ReadOnlyList<Js::JavascriptExceptionContext::StackFrame,_Memory::Recycler,_DefaultComparer>)
  .buffer.ptr = (StackFrame *)0x0;
  (this_00->
  super_ReadOnlyList<Js::JavascriptExceptionContext::StackFrame,_Memory::Recycler,_DefaultComparer>)
  .count = 0;
  this_00->length = 0;
  this_00->increment = 4;
  if (stackCrawlLimit != 0) {
    if (DAT_015bc474 == '\x01') {
      bVar4 = scriptContext->threadContext->hasCatchHandler;
      initArgumentTypes = bVar4 ^ 1;
      if (thrownObject != (Var)0x0 && bVar4 == false) {
        bVar4 = VarIs<Js::JavascriptError>(thrownObject);
        if (bVar4) {
          pJVar9 = VarTo<Js::JavascriptError>(thrownObject);
          walker.currentFrame.stackCheckCodeHeight = 0;
          pJVar2 = (pJVar9->exceptionObject).ptr;
          if (!resetStack) {
            iVar7 = (*(pJVar9->super_DynamicObject).super_RecyclableObject.super_FinalizableObject.
                      super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x14])
                              (pJVar9,pJVar9,5,&walker.currentFrame.stackCheckCodeHeight,0,
                               scriptContext);
            if (walker.currentFrame.stackCheckCodeHeight != 0 && iVar7 != 0) {
              JavascriptExceptionContext::SetOriginalStackTrace
                        (exceptionContext,(StackTrace *)walker.currentFrame.stackCheckCodeHeight);
              goto LAB_00a95b58;
            }
          }
          if (pJVar2 != (JavascriptExceptionObject *)0x0) {
            JavascriptExceptionContext::SetOriginalStackTrace
                      (exceptionContext,(pJVar2->exceptionContext).m_stackTrace.ptr);
          }
        }
      }
    }
    else {
      initArgumentTypes = false;
    }
LAB_00a95b58:
    uVar10 = 1;
    this = &walker.currentFrame.stackCheckCodeHeight;
    do {
      JavascriptExceptionContext::StackFrame::StackFrame
                ((StackFrame *)this,pJStack_48,(JavascriptStackWalker *)local_128,
                 (bool)initArgumentTypes);
      JsUtil::
      List<Js::JavascriptExceptionContext::StackFrame,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
      ::EnsureArray(this_00,0);
      JavascriptExceptionContext::StackFrame::operator=
                ((this_00->
                 super_ReadOnlyList<Js::JavascriptExceptionContext::StackFrame,_Memory::Recycler,_DefaultComparer>
                 ).buffer.ptr +
                 (this_00->
                 super_ReadOnlyList<Js::JavascriptExceptionContext::StackFrame,_Memory::Recycler,_DefaultComparer>
                 ).count,(StackFrame *)this);
      pTVar1 = &(this_00->
                super_ReadOnlyList<Js::JavascriptExceptionContext::StackFrame,_Memory::Recycler,_DefaultComparer>
                ).count;
      *pTVar1 = *pTVar1 + 1;
      bVar4 = JavascriptStackWalker::GetDisplayCaller
                        ((JavascriptStackWalker *)local_128,&stack0xffffffffffffffb8);
      bVar11 = uVar10 < stackCrawlLimit;
      uVar10 = uVar10 + 1;
    } while (bVar4 && bVar11);
  }
  BVar5 = JsUtil::ExternalApi::IsScriptActiveOnCurrentThreadContext();
  if (BVar5 == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptExceptionOperators.cpp"
                       ,0x49d,"(JsUtil::ExternalApi::IsScriptActiveOnCurrentThreadContext())",
                       "JsUtil::ExternalApi::IsScriptActiveOnCurrentThreadContext()");
    if (!bVar4) {
LAB_00a95e34:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar8 = 0;
  }
  AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType(&local_4c);
  addr = &exceptionContext->m_stackTrace;
  Memory::Recycler::WBSetBit((char *)addr);
  addr->ptr = this_00;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
  DumpStackTrace(exceptionContext,isThrownException);
LAB_00a95c51:
  JavascriptStackWalker::~JavascriptStackWalker((JavascriptStackWalker *)local_128);
  return this_01;
}

Assistant:

JavascriptFunction *
    JavascriptExceptionOperators::WalkStackForExceptionContextInternal(ScriptContext& scriptContext, JavascriptExceptionContext& exceptionContext, Var thrownObject,
        uint32& callerByteCodeOffset, uint64 stackCrawlLimit, PVOID returnAddress, bool isThrownException, bool resetStack)
    {
        JavascriptStackWalker walker(&scriptContext, true, returnAddress);
        JavascriptFunction* jsFunc = nullptr;

        if (!GetCaller(walker, jsFunc))
        {
            return nullptr;
        }

        // Skip to first non-Library code
        // Similar behavior to GetCaller returning false
        if(jsFunc->IsLibraryCode() && !walker.GetNonLibraryCodeCaller(&jsFunc))
        {
            return nullptr;
        }

        JavascriptFunction * caller = jsFunc;
        callerByteCodeOffset = walker.GetByteCodeOffset();

        Assert(!caller->IsLibraryCode());
        // NOTE Don't set the throwing exception here, because we might need to box it and will cause a nested stack walker
        // instead, return it to be set in WalkStackForExceptionContext

        JavascriptExceptionContext::StackTrace *stackTrace = nullptr;
        // If we take an OOM (JavascriptException for OOM if script is active), just bail early and return what we've got
        HRESULT hr;
        BEGIN_TRANSLATE_EXCEPTION_AND_ERROROBJECT_TO_HRESULT_NESTED
        {
            stackTrace = RecyclerNew(scriptContext.GetRecycler(), JavascriptExceptionContext::StackTrace, scriptContext.GetRecycler());
            if (stackCrawlLimit > 0)
            {
                const bool crawlStackForWER = CrawlStackForWER(scriptContext);

                // In WER scenario, we should combine the original stack with latest throw stack as the final throw might be coming form
                // a different stack.
                uint64 i = 1;
                if (crawlStackForWER && thrownObject && Js::VarIs<Js::JavascriptError>(thrownObject))
                {
                    Js::JavascriptError* errorObject = Js::VarTo<Js::JavascriptError>(thrownObject);
                    Js::JavascriptExceptionContext::StackTrace *originalStackTrace = NULL;
                    const Js::JavascriptExceptionObject* originalExceptionObject = errorObject->GetJavascriptExceptionObject();
                    if (!resetStack && errorObject->GetInternalProperty(errorObject, InternalPropertyIds::StackTrace, (Js::Var*) &originalStackTrace, NULL, &scriptContext) &&
                        (originalStackTrace != nullptr))
                    {
                        exceptionContext.SetOriginalStackTrace(originalStackTrace);
                    }
                    else
                    {
                        if (originalExceptionObject != nullptr)
                        {
                            exceptionContext.SetOriginalStackTrace(originalExceptionObject->GetExceptionContext()->GetStackTrace());
                        }
                    }
                }

                do
                {
                    JavascriptExceptionContext::StackFrame stackFrame(jsFunc, walker, crawlStackForWER);
                    stackTrace->Add(stackFrame);
                } while (walker.GetDisplayCaller(&jsFunc) && i++ < stackCrawlLimit);
            }
        }